

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  ostream *poVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr __n;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  stringstream *psVar7;
  const_iterator cVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  char *extraout_RAX;
  _Alloc_hider _Var11;
  char *pcVar12;
  string *name;
  char *pcVar13;
  pointer __k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string local_c8;
  TypedTestCasePState *local_a8;
  int local_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_78 [32];
  _Base_ptr local_58;
  size_t local_50;
  char *local_48;
  char *local_40;
  stringstream *local_38;
  
  *this = (TypedTestCasePState)0x1;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar12 = registered_tests + -1;
  local_a8 = this;
  local_9c = line;
  local_48 = file;
  local_40 = registered_tests;
  do {
    pbVar2 = (byte *)(pcVar12 + 1);
    pcVar12 = pcVar12 + 1;
    iVar4 = isspace((uint)*pbVar2);
  } while (iVar4 != 0);
  paVar3 = &local_c8.field_2;
  do {
    pcVar5 = strchr(pcVar12,0x2c);
    local_c8._M_dataplus._M_p = (pointer)paVar3;
    if (pcVar5 == (char *)0x0) {
      sVar6 = strlen(pcVar12);
      pcVar5 = pcVar12 + sVar6;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar12,pcVar5);
    _Var11._M_p = local_c8._M_dataplus._M_p;
    if (local_c8._M_string_length != 0) {
      pcVar5 = local_c8._M_dataplus._M_p + local_c8._M_string_length;
      do {
        _Var11._M_p = local_c8._M_dataplus._M_p;
        iVar4 = isspace((uint)(byte)pcVar5[-1]);
        if (iVar4 == 0) break;
        std::__cxx11::string::_M_erase((ulong)&local_c8,(ulong)(pcVar5 + (-1 - (long)_Var11._M_p)));
        pcVar13 = pcVar5 + (-1 - (long)_Var11._M_p);
        pcVar5 = local_c8._M_dataplus._M_p + (long)pcVar13;
        _Var11._M_p = local_c8._M_dataplus._M_p;
      } while (pcVar13 != (char *)0x0);
    }
    local_78._0_8_ = _Var11._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var11._M_p == paVar3) {
      local_78._24_8_ = local_c8.field_2._8_8_;
      local_78._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_78 + 0x10);
    }
    local_78._17_7_ = local_c8.field_2._M_allocated_capacity._1_7_;
    local_78[0x10] = local_c8.field_2._M_local_buf[0];
    local_78._8_8_ = local_c8._M_string_length;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_c8._M_dataplus._M_p = (pointer)paVar3;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar3) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    pcVar12 = strchr(pcVar12,0x2c);
    if (pcVar12 == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      do {
        pbVar2 = (byte *)(pcVar12 + 1);
        pcVar12 = pcVar12 + 1;
        iVar4 = isspace((uint)*pbVar2);
      } while (iVar4 != 0);
    }
  } while (pcVar12 != (char *)0x0);
  psVar7 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(psVar7);
  poVar1 = (ostream *)(psVar7 + 0x10);
  *(undefined8 *)(psVar7 + *(long *)(*(long *)(psVar7 + 0x10) + -0x18) + 0x18) = 0x11;
  local_78._24_8_ = local_78 + 8;
  local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
  local_78._16_8_ = (_Link_type)0x0;
  local_50 = 0;
  local_58 = (_Base_ptr)local_78._24_8_;
  local_38 = psVar7;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var10 = (_Rb_tree_node_base *)(local_a8 + 0x10);
    __k = local_98.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,__k);
      if (cVar8._M_node == (_Base_ptr)(local_78 + 8)) {
        p_Var9 = *(_Rb_tree_node_base **)(local_a8 + 0x20);
        if (p_Var9 != p_Var10) {
          __n = (_Base_ptr)__k->_M_string_length;
          do {
            if ((__n == p_Var9[1]._M_parent) &&
               ((__n == (_Base_ptr)0x0 ||
                (iVar4 = bcmp((__k->_M_dataplus)._M_p,*(void **)(p_Var9 + 1),(size_t)__n),
                iVar4 == 0)))) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_78,__k);
              goto LAB_00210c2c;
            }
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != p_Var10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"No test named ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1," can be found in this test case.\n",0x21);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Test ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1," is listed more than once.\n",0x1b);
      }
LAB_00210c2c:
      __k = __k + 1;
    } while (__k != local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var10 = *(_Rb_tree_node_base **)(local_a8 + 0x20);
  p_Var9 = (_Rb_tree_node_base *)(local_a8 + 0x10);
  if (p_Var10 != p_Var9) {
    do {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78,(key_type *)(p_Var10 + 1));
      if (cVar8._M_node == (_Base_ptr)(local_78 + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var9);
  }
  psVar7 = local_38;
  StringStreamToString(&local_c8,(stringstream *)local_38);
  iVar4 = std::__cxx11::string::compare((char *)&local_c8);
  if (iVar4 != 0) {
    pcVar5 = local_48;
    VerifyRegisteredTestNames();
    pcVar12 = extraout_RAX;
    if (*(_List_node_base **)(pcVar5 + 0x58) != (_List_node_base *)(pcVar5 + 0x58)) {
      std::__detail::_List_node_base::_M_transfer
                ((_List_node_base *)(pcVar5 + 0x28),*(_List_node_base **)(pcVar5 + 0x58));
      pcVar12 = *(char **)(pcVar5 + 0x68);
      *(char **)(pcVar5 + 0x38) = pcVar12 + *(long *)(pcVar5 + 0x38);
      pcVar5[0x68] = '\0';
      pcVar5[0x69] = '\0';
      pcVar5[0x6a] = '\0';
      pcVar5[0x6b] = '\0';
      pcVar5[0x6c] = '\0';
      pcVar5[0x6d] = '\0';
      pcVar5[0x6e] = '\0';
      pcVar5[0x6f] = '\0';
    }
    if (*(_List_node_base **)(pcVar5 + 0x40) != (_List_node_base *)(pcVar5 + 0x40)) {
      std::__detail::_List_node_base::_M_transfer
                ((_List_node_base *)(pcVar5 + 0x28),*(_List_node_base **)(pcVar5 + 0x40));
      pcVar12 = *(char **)(pcVar5 + 0x50);
      *(char **)(pcVar5 + 0x38) = pcVar12 + *(long *)(pcVar5 + 0x38);
      pcVar5[0x50] = '\0';
      pcVar5[0x51] = '\0';
      pcVar5[0x52] = '\0';
      pcVar5[0x53] = '\0';
      pcVar5[0x54] = '\0';
      pcVar5[0x55] = '\0';
      pcVar5[0x56] = '\0';
      pcVar5[0x57] = '\0';
    }
    return pcVar12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,(_Link_type)local_78._16_8_);
  (**(code **)(*(long *)psVar7 + 8))(psVar7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return local_40;
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}